

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_paste_replace(_glist *x)

{
  long *plVar1;
  _class **pp_Var2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  t_object *ptVar5;
  t_symbol *ptVar6;
  long *plVar7;
  void *pvVar8;
  int iVar9;
  _gobj *p_Var10;
  long *fatso;
  _gobj *y;
  int iVar11;
  t_selection *ptVar12;
  int dy;
  t_symbol *ptVar13;
  bool bVar14;
  bool bVar15;
  int y0;
  int x0;
  t_symbol *typ0;
  int local_48;
  int local_44;
  _glist *local_40;
  t_symbol *local_38;
  
  local_44 = 0;
  local_48 = 0;
  local_38 = (t_symbol *)0x0;
  if (x->gl_editor == (t_editor *)0x0) {
    return;
  }
  if (x->gl_editor->e_selection == (t_selection *)0x0) {
    return;
  }
  iVar4 = binbuf_getpos(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor,&local_44,&local_48,
                        &local_38);
  if (iVar4 != 1) {
    return;
  }
  local_40 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar4));
  ptVar12 = x->gl_editor->e_selection;
  if (ptVar12 != (t_selection *)0x0) {
    ptVar13 = (t_symbol *)0x0;
    do {
      ptVar5 = pd_checkobject(&ptVar12->sel_what->g_pd);
      ptVar6 = get_object_type(ptVar5);
      if ((ptVar6 != (t_symbol *)0x0) &&
         (bVar14 = ptVar13 != (t_symbol *)0x0, bVar15 = ptVar13 != ptVar6, ptVar13 = ptVar6,
         bVar14 && bVar15)) {
        ptVar13 = (t_symbol *)0x0;
        break;
      }
      ptVar12 = ptVar12->sel_next;
    } while (ptVar12 != (_selection *)0x0);
    ptVar12 = x->gl_editor->e_selection;
    if (ptVar12 != (t_selection *)0x0) {
      fatso = (long *)0x0;
      do {
        ptVar5 = pd_checkobject(&ptVar12->sel_what->g_pd);
        if ((ptVar5 != (t_object *)0x0) &&
           ((ptVar13 != (t_symbol *)0x0 || (ptVar6 = get_object_type(ptVar5), ptVar6 == local_38))))
        {
          plVar7 = (long *)getbytes(0x10);
          *plVar7 = (long)ptVar12->sel_what;
          plVar7[1] = (long)fatso;
          fatso = plVar7;
        }
        ptVar12 = ptVar12->sel_next;
      } while (ptVar12 != (_selection *)0x0);
      canvas_undo_add(x,UNDO_SEQUENCE_START,"paste/replace",(void *)0x0);
      plVar7 = fatso;
      if (fatso != (long *)0x0) {
        do {
          iVar4 = *(short *)(*plVar7 + 0x28) - local_44;
          dy = *(short *)(*plVar7 + 0x2a) - local_48;
          glist_noselect(x);
          *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x40) = 0;
          pvVar8 = canvas_undo_set_arrange(x,(t_gobj *)*plVar7,1);
          canvas_undo_add(x,UNDO_ARRANGE,"arrange",pvVar8);
          canvas_stowconnections(local_40);
          pvVar8 = canvas_undo_set_cut(x,2);
          canvas_undo_add(x,UNDO_CUT,"clear",pvVar8);
          canvas_doclear(x);
          canvas_applybinbuf(x,*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
          glist_noselect(x);
          y = x->gl_list;
          if (y == (t_gobj *)0x0) {
            y = (t_gobj *)0x0;
          }
          else {
            iVar9 = 1;
            p_Var10 = y;
            iVar3 = -1;
            do {
              iVar11 = iVar3;
              p_Var10 = p_Var10->g_next;
              iVar9 = iVar9 + -1;
              iVar3 = iVar11 + 1;
            } while (p_Var10 != (_gobj *)0x0);
            do {
              iVar3 = iVar11;
              if (iVar9 == 0) break;
              y = y->g_next;
              iVar11 = iVar3 + -1;
              iVar9 = iVar3;
            } while (y != (_gobj *)0x0);
          }
          glist_select(x,y);
          canvas_displaceselection(x,iVar4,dy);
          pp_Var2 = s__X.s_thing;
          s__X.s_thing = (_class **)local_40;
          binbuf_eval(local_40->gl_editor->e_connectbuf,(t_pd *)0x0,0,(t_atom *)0x0);
          s__X.s_thing = pp_Var2;
          pvVar8 = canvas_undo_set_create(x);
          canvas_undo_add(x,UNDO_CREATE,"create",pvVar8);
          if ((pd_maininstance.pd_newest != (t_pd *)0x0) &&
             (*pd_maininstance.pd_newest == canvas_class)) {
            canvas_loadbang((_glist *)pd_maininstance.pd_newest);
          }
          plVar1 = plVar7 + 1;
          plVar7 = (long *)*plVar1;
          if ((long *)*plVar1 == (long *)0x0) {
            canvas_undo_add(x,UNDO_SEQUENCE_END,"paste/replace",(void *)0x0);
            while (fatso != (long *)0x0) {
              plVar7 = (long *)fatso[1];
              freebytes(fatso,0x10);
              fatso = plVar7;
            }
            return;
          }
        } while( true );
      }
      goto LAB_00143047;
    }
  }
  canvas_undo_add(x,UNDO_SEQUENCE_START,"paste/replace",(void *)0x0);
LAB_00143047:
  canvas_undo_add(x,UNDO_SEQUENCE_END,"paste/replace",(void *)0x0);
  return;
}

Assistant:

static void canvas_paste_replace(t_canvas *x)
{
    int x0=0, y0=0;
    t_symbol *typ0 = 0;
    if (!x->gl_editor)
        return;
    if(x->gl_editor->e_selection && 1==binbuf_getpos(EDITOR->copy_binbuf, &x0, &y0, &typ0))
    {
        t_canvas *canvas = glist_getcanvas(x);
        t_selection *mysel = 0, *y;
        t_symbol *seltype = 0;

            /* check whether all the selected objects have the same type */
        for (y = x->gl_editor->e_selection; y; y = y->sel_next)
        {
            t_symbol *s=get_object_type(pd_checkobject(&y->sel_what->g_pd));
            if (!s)
                continue;
            if(seltype && seltype != s)
            {
                seltype = 0;
                break;
            }
            seltype = s;
        }

            /* we will do a lot of reslecting; so copy the selection */
        for (y = x->gl_editor->e_selection; y; y = y->sel_next)
        {
            t_selection *sel = 0;
            t_object *obj=pd_checkobject(&y->sel_what->g_pd);
            if(!obj)
               continue;
                    /* if the selection mixes obj, msg,... we only want to
                     * replace the same type;
                     * if the selection is homogeneous (seltype==NULL), we also allow typechanges
                     */
            if (!seltype && get_object_type(obj) != typ0)
                continue;
            sel = (t_selection *)getbytes(sizeof(*sel));
            sel->sel_what = y->sel_what;
            sel->sel_next = mysel;
            mysel = sel;
        }

        canvas_undo_add(x, UNDO_SEQUENCE_START, "paste/replace", 0);

        for (y = mysel; y; y = y->sel_next)
        {
            t_object *o = (t_object *)(&y->sel_what->g_pd);
            int dx = o->te_xpix - x0;
            int dy = o->te_ypix - y0;
            glist_noselect(x);
            EDITOR->canvas_undo_already_set_move = 0;
                /* save connections and move object to the end */
                /* note: the undo sequence selects the object as a side-effect */
            canvas_undo_add(x, UNDO_ARRANGE, "arrange",
                canvas_undo_set_arrange(x, y->sel_what, 1));
            canvas_stowconnections(canvas);
                /* recreate object */
                /* remove the old object */
            canvas_undo_add(x, UNDO_CUT, "clear",
                canvas_undo_set_cut(x, UCUT_CLEAR));
            canvas_doclear(x);

                /* create the new object (and loadbang if needed) */
            canvas_applybinbuf(x, EDITOR->copy_binbuf);

            glist_noselect(x);
            glist_select(x, glist_nth(x, glist_getindex(x, 0) - 1));
                /* displace object (includes UNDO) */
            canvas_displaceselection(x, dx, dy);
                /* restore connections */
            canvas_restoreconnections(canvas);

            canvas_undo_add(x, UNDO_CREATE, "create",
                (void *)canvas_undo_set_create(x));

            if (pd_this->pd_newest && pd_class(pd_this->pd_newest) == canvas_class)
                canvas_loadbang((t_canvas *)pd_this->pd_newest);
        }
        canvas_undo_add(x, UNDO_SEQUENCE_END, "paste/replace", 0);

            /* free the selection copy */
        for (y = mysel; y; )
        {
            t_selection*next = y->sel_next;
            freebytes(y, sizeof(*y));
            y = next;
        }

    }
}